

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_buffinitsize(lua_State *L,luaL_Buffer *B,size_t sz)

{
  char *pcVar1;
  
  B->L = L;
  B->b = (char *)&B->init;
  B->n = 0;
  B->size = 0x400;
  lua_pushlightuserdata(L,B);
  pcVar1 = prepbuffsize(B,sz,-1);
  return pcVar1;
}

Assistant:

LUALIB_API char *luaL_buffinitsize (lua_State *L, luaL_Buffer *B, size_t sz) {
  luaL_buffinit(L, B);
  return prepbuffsize(B, sz, -1);
}